

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O1

void enet_host_destroy(ENetHost *host)

{
  ENetPeer *pEVar1;
  ENetPeer *peer;
  
  if (host == (ENetHost *)0x0) {
    return;
  }
  if (host->socket != -1) {
    close(host->socket);
  }
  pEVar1 = host->peers;
  peer = pEVar1;
  if (0 < (long)host->peerCount) {
    do {
      enet_peer_reset(peer);
      peer = peer + 1;
      pEVar1 = host->peers;
    } while (peer < pEVar1 + host->peerCount);
  }
  (*(code *)callbacks_1)(pEVar1);
  (*(code *)callbacks_1)(host);
  return;
}

Assistant:

void enet_host_destroy(ENetHost* host) {
	ENetPeer* currentPeer;

	ENET_LOG_TRACE("A ENet host object is being destroyed.");

	if (host == NULL)
		return;

	enet_socket_destroy(host->socket);

	for (currentPeer = host->peers; currentPeer < &host->peers[host->peerCount]; ++currentPeer) {
		enet_peer_reset(currentPeer);
	}

	enet_free(host->peers);
	enet_free(host);
}